

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_secp256k1.cpp
# Opt level: O2

void __thiscall
cfd::core::Secp256k1::RangeProofInfoSecp256k1
          (Secp256k1 *this,ByteData *range_proof,int *exponent,int *mantissa,uint64_t *min_value,
          uint64_t *max_value)

{
  void *pvVar1;
  size_t sVar2;
  CfdException *pCVar3;
  allocator local_75;
  int ret;
  undefined1 local_70 [32];
  uint64_t *local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> range_proof_bytes;
  
  pvVar1 = this->secp256k1_context_;
  if (pvVar1 == (void *)0x0) {
    local_70._0_8_ = "cfdcore_secp256k1.cpp";
    local_70._8_4_ = 0x1d9;
    local_70._16_8_ = "RangeProofInfoSecp256k1";
    logger::warn<>((CfdSourceLocation *)local_70,"Secp256k1 context is NULL.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_70,"Secp256k1 context is NULL.",(allocator *)&range_proof_bytes);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_70);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_50 = max_value;
  sVar2 = ByteData::GetDataSize(range_proof);
  if (sVar2 != 0) {
    ByteData::GetBytes(&range_proof_bytes,range_proof);
    ret = secp256k1_rangeproof_info
                    (pvVar1,exponent,mantissa,min_value,local_50,
                     range_proof_bytes.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (long)range_proof_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)range_proof_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
    if (ret == 1) {
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&range_proof_bytes.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return;
    }
    local_70._0_8_ = "cfdcore_secp256k1.cpp";
    local_70._8_4_ = 0x1e9;
    local_70._16_8_ = "RangeProofInfoSecp256k1";
    logger::warn<int&>((CfdSourceLocation *)local_70,"secp256k1_rangeproof_info Error.({})",&ret);
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_70,"Secp256k1 decode range proof info Error.",&local_75);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_70);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_70._0_8_ = "cfdcore_secp256k1.cpp";
  local_70._8_4_ = 0x1de;
  local_70._16_8_ = "RangeProofInfoSecp256k1";
  logger::warn<>((CfdSourceLocation *)local_70,"Secp256k1 range proof is empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)local_70,"Secp256k1 empty range proof Error.",(allocator *)&range_proof_bytes
            );
  CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_70);
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Secp256k1::RangeProofInfoSecp256k1(
    const ByteData& range_proof, int* exponent, int* mantissa,
    uint64_t* min_value, uint64_t* max_value) {
  secp256k1_context* context =
      static_cast<secp256k1_context*>(secp256k1_context_);
  if (secp256k1_context_ == nullptr) {
    warn(CFD_LOG_SOURCE, "Secp256k1 context is NULL.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 context is NULL.");
  }
  if (!range_proof.GetDataSize()) {
    warn(CFD_LOG_SOURCE, "Secp256k1 range proof is empty.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 empty range proof Error.");
  }

  std::vector<uint8_t> range_proof_bytes = range_proof.GetBytes();
  int ret = secp256k1_rangeproof_info(
      context, exponent, mantissa, min_value, max_value,
      range_proof_bytes.data(), range_proof_bytes.size());
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_rangeproof_info Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 decode range proof info Error.");
  }
}